

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraMan.c
# Opt level: O1

void Fra_ManPrint(Fra_Man_t *p)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int level;
  FILE *pFVar9;
  Fra_Man_t *pFVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  
  lVar1 = (long)p->pSml->nWordsTotal * 4 + 0x30;
  auVar13._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar13._0_8_ = lVar1;
  auVar13._12_4_ = 0x45300000;
  dVar11 = 1.0;
  if (p->nLitsBeg != 0) {
    dVar11 = (double)p->nLitsBeg;
  }
  printf("SimWord = %d. Round = %d.  Mem = %0.2f MB.  LitBeg = %d.  LitEnd = %d. (%6.2f %%).\n",
         ((auVar13._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) *
         (double)p->pManAig->vObjs->nSize * 9.5367431640625e-07,
         ((double)p->nLitsEnd * 100.0) / dVar11,(ulong)(uint)p->pPars->nSimWords,
         (ulong)(uint)p->pSml->nSimRounds);
  uVar2 = p->nSatProof;
  uVar3 = p->nSatCallsSat;
  uVar4 = p->nSatFails;
  uVar5 = p->nSatFailsReal;
  uVar6 = p->pPars->nBTLimitNode;
  Fra_ImpComputeStateSpaceRatio(p);
  printf("Proof = %d. Cex = %d. Fail = %d. FailReal = %d. C-lim = %d. ImpRatio = %6.2f %%\n",
         (ulong)uVar2,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,(ulong)uVar6);
  iVar7 = p->nNodesBeg;
  dVar12 = 1.0;
  dVar11 = 1.0;
  if (iVar7 != 0) {
    dVar11 = (double)iVar7;
  }
  iVar8 = p->nRegsBeg;
  if (iVar8 != 0) {
    dVar12 = (double)iVar8;
  }
  level = 0x958ee9;
  printf("NBeg = %d. NEnd = %d. (Gain = %6.2f %%).  RBeg = %d. REnd = %d. (Gain = %6.2f %%).\n",
         ((double)(iVar7 - p->nNodesEnd) * 100.0) / dVar11,
         ((double)(iVar8 - p->nRegsEnd) * 100.0) / dVar12);
  if (p->pSat != (sat_solver *)0x0) {
    pFVar9 = _stdout;
    Sat_SolverPrintStats((FILE *)_stdout,p->pSat);
    level = (int)pFVar9;
  }
  if (p->pPars->fUse1Hot != 0) {
    pFVar10 = p;
    Fra_OneHotEstimateCoverage(p,p->vOneHots);
    level = (int)pFVar10;
  }
  Abc_Print(level,"%s =","AIG simulation  ");
  Abc_Print(level,"%9.2f sec\n",(double)p->pSml->timeSim / 1000000.0);
  Abc_Print(level,"%s =","AIG traversal   ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeTrav / 1000000.0);
  if (p->timeRwr != 0) {
    Abc_Print(level,"%s =","AIG rewriting   ");
    Abc_Print(level,"%9.2f sec\n",(double)p->timeRwr / 1000000.0);
  }
  Abc_Print(level,"%s =","SAT solving     ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeSat / 1000000.0);
  Abc_Print(level,"%s =","    Unsat       ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeSatUnsat / 1000000.0);
  Abc_Print(level,"%s =","    Sat         ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeSatSat / 1000000.0);
  Abc_Print(level,"%s =","    Fail        ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeSatFail / 1000000.0);
  Abc_Print(level,"%s =","Class refining  ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeRef / 1000000.0);
  Abc_Print(level,"%s =","TOTAL RUNTIME   ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeTotal / 1000000.0);
  if (p->time1 != 0) {
    Abc_Print(level,"%s =","time1           ");
    Abc_Print(level,"%9.2f sec\n",(double)p->time1 / 1000000.0);
  }
  if (p->nSpeculs != 0) {
    printf("Speculations = %d.\n");
  }
  fflush(_stdout);
  return;
}

Assistant:

void Fra_ManPrint( Fra_Man_t * p )
{
    double nMemory = 1.0*Aig_ManObjNumMax(p->pManAig)*(p->pSml->nWordsTotal*sizeof(unsigned)+6*sizeof(void*))/(1<<20);
    printf( "SimWord = %d. Round = %d.  Mem = %0.2f MB.  LitBeg = %d.  LitEnd = %d. (%6.2f %%).\n", 
        p->pPars->nSimWords, p->pSml->nSimRounds, nMemory, p->nLitsBeg, p->nLitsEnd, 100.0*p->nLitsEnd/(p->nLitsBeg?p->nLitsBeg:1) );
    printf( "Proof = %d. Cex = %d. Fail = %d. FailReal = %d. C-lim = %d. ImpRatio = %6.2f %%\n", 
        p->nSatProof, p->nSatCallsSat, p->nSatFails, p->nSatFailsReal, p->pPars->nBTLimitNode, Fra_ImpComputeStateSpaceRatio(p) );
    printf( "NBeg = %d. NEnd = %d. (Gain = %6.2f %%).  RBeg = %d. REnd = %d. (Gain = %6.2f %%).\n", 
        p->nNodesBeg, p->nNodesEnd, 100.0*(p->nNodesBeg-p->nNodesEnd)/(p->nNodesBeg?p->nNodesBeg:1), 
        p->nRegsBeg, p->nRegsEnd, 100.0*(p->nRegsBeg-p->nRegsEnd)/(p->nRegsBeg?p->nRegsBeg:1) );
    if ( p->pSat )             Sat_SolverPrintStats( stdout, p->pSat );
    if ( p->pPars->fUse1Hot )  Fra_OneHotEstimateCoverage( p, p->vOneHots );
    ABC_PRT( "AIG simulation  ", p->pSml->timeSim  );
    ABC_PRT( "AIG traversal   ", p->timeTrav );
    if ( p->timeRwr )
    {
    ABC_PRT( "AIG rewriting   ", p->timeRwr  );
    }
    ABC_PRT( "SAT solving     ", p->timeSat  );
    ABC_PRT( "    Unsat       ", p->timeSatUnsat );
    ABC_PRT( "    Sat         ", p->timeSatSat   );
    ABC_PRT( "    Fail        ", p->timeSatFail  );
    ABC_PRT( "Class refining  ", p->timeRef   );
    ABC_PRT( "TOTAL RUNTIME   ", p->timeTotal );
    if ( p->time1 ) { ABC_PRT( "time1           ", p->time1 ); }
    if ( p->nSpeculs )
    printf( "Speculations = %d.\n", p->nSpeculs );
    fflush( stdout );
}